

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.c
# Opt level: O0

utf8proc_ssize_t
utf8proc_map_custom(utf8proc_uint8_t *str,utf8proc_ssize_t strlen,utf8proc_uint8_t **dstptr,
                   utf8proc_option_t options,utf8proc_custom_func custom_func,void *custom_data)

{
  void *__ptr;
  void *pvVar1;
  undefined8 *in_RDX;
  utf8proc_int32_t *in_R9;
  utf8proc_custom_func unaff_retaddr;
  utf8proc_int32_t *newptr;
  utf8proc_ssize_t result;
  utf8proc_int32_t *buffer;
  undefined8 local_8;
  
  *in_RDX = 0;
  local_8 = utf8proc_decompose_custom
                      ((utf8proc_uint8_t *)custom_func,(utf8proc_ssize_t)custom_data,buffer,result,
                       newptr._4_4_,unaff_retaddr,(void *)strlen);
  if (-1 < local_8) {
    __ptr = malloc(local_8 * 4 + 1);
    if (__ptr == (void *)0x0) {
      local_8 = -1;
    }
    else {
      local_8 = utf8proc_decompose_custom
                          ((utf8proc_uint8_t *)custom_func,(utf8proc_ssize_t)custom_data,buffer,
                           result,newptr._4_4_,unaff_retaddr,(void *)strlen);
      if (local_8 < 0) {
        free(__ptr);
      }
      else {
        local_8 = utf8proc_reencode(in_R9,(utf8proc_ssize_t)__ptr,
                                    (utf8proc_option_t)((ulong)local_8 >> 0x20));
        if (local_8 < 0) {
          free(__ptr);
        }
        else {
          pvVar1 = realloc(__ptr,local_8 + 1);
          if (pvVar1 != (void *)0x0) {
            __ptr = pvVar1;
          }
          *in_RDX = __ptr;
        }
      }
    }
  }
  return local_8;
}

Assistant:

UTF8PROC_DLLEXPORT utf8proc_ssize_t utf8proc_map_custom(
  const utf8proc_uint8_t *str, utf8proc_ssize_t strlen, utf8proc_uint8_t **dstptr, utf8proc_option_t options,
  utf8proc_custom_func custom_func, void *custom_data
) {
  utf8proc_int32_t *buffer;
  utf8proc_ssize_t result;
  *dstptr = NULL;
  result = utf8proc_decompose_custom(str, strlen, NULL, 0, options, custom_func, custom_data);
  if (result < 0) return result;
  buffer = (utf8proc_int32_t *) malloc(((utf8proc_size_t)result) * sizeof(utf8proc_int32_t) + 1);
  if (!buffer) return UTF8PROC_ERROR_NOMEM;
  result = utf8proc_decompose_custom(str, strlen, buffer, result, options, custom_func, custom_data);
  if (result < 0) {
    free(buffer);
    return result;
  }
  result = utf8proc_reencode(buffer, result, options);
  if (result < 0) {
    free(buffer);
    return result;
  }
  {
    utf8proc_int32_t *newptr;
    newptr = (utf8proc_int32_t *) realloc(buffer, (size_t)result+1);
    if (newptr) buffer = newptr;
  }
  *dstptr = (utf8proc_uint8_t *)buffer;
  return result;
}